

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# arena.h
# Opt level: O0

OneOf_<kj::parse::ParserRef<kj::parse::IteratorInput<capnp::compiler::Token::Reader,_capnp::_::IndexingIterator<const_capnp::List<capnp::compiler::Token,_(capnp::Kind)3>::Reader,_capnp::compiler::Token::Reader>_>,_capnp::compiler::CapnpParser::DeclParserResult>_&,_kj::parse::ParserRef<kj::parse::IteratorInput<capnp::compiler::Token::Reader,_capnp::_::IndexingIterator<const_capnp::List<capnp::compiler::Token,_(capnp::Kind)3>::Reader,_capnp::compiler::Token::Reader>_>,_capnp::compiler::CapnpParser::DeclParserResult>_&,_kj::parse::ParserRef<kj::parse::IteratorInput<capnp::compiler::Token::Reader,_capnp::_::IndexingIterator<const_capnp::List<capnp::compiler::Token,_(capnp::Kind)3>::Reader,_capnp::compiler::Token::Reader>_>,_capnp::compiler::CapnpParser::DeclParserResult>_&,_kj::parse::ParserRef<kj::parse::IteratorInput<capnp::compiler::Token::Reader,_capnp::_::IndexingIterator<const_capnp::List<capnp::compiler::Token,_(capnp::Kind)3>::Reader,_capnp::compiler::Token::Reader>_>,_capnp::compiler::CapnpParser::DeclParserResult>_&,_kj::parse::ParserRef<kj::parse::IteratorInput<capnp::compiler::Token::Reader,_capnp::_::IndexingIterator<const_capnp::List<capnp::compiler::Token,_(capnp::Kind)3>::Reader,_capnp::compiler::Token::Reader>_>,_capnp::compiler::CapnpParser::DeclParserResult>_&,_kj::parse::ParserRef<kj::parse::IteratorInput<capnp::compiler::Token::Reader,_capnp::_::IndexingIterator<const_capnp::List<capnp::compiler::Token,_(capnp::Kind)3>::Reader,_capnp::compiler::Token::Reader>_>,_capnp::compiler::CapnpParser::DeclParserResult>_&>
* __thiscall
kj::Arena::
allocate<kj::parse::OneOf_<kj::parse::ParserRef<kj::parse::IteratorInput<capnp::compiler::Token::Reader,capnp::_::IndexingIterator<capnp::List<capnp::compiler::Token,(capnp::Kind)3>::Reader_const,capnp::compiler::Token::Reader>>,capnp::compiler::CapnpParser::DeclParserResult>&,kj::parse::ParserRef<kj::parse::IteratorInput<capnp::compiler::Token::Reader,capnp::_::IndexingIterator<capnp::List<capnp::compiler::Token,(capnp::Kind)3>::Reader_const,capnp::compiler::Token::Reader>>,capnp::compiler::CapnpParser::DeclParserResult>&,kj::parse::ParserRef<kj::parse::IteratorInput<capnp::compiler::Token::Reader,capnp::_::IndexingIterator<capnp::List<capnp::compiler::Token,(capnp::Kind)3>::Reader_const,capnp::compiler::Token::Reader>>,capnp::compiler::CapnpParser::DeclParserResult>&,kj::parse::ParserRef<kj::parse::IteratorInput<capnp::compiler::Token::Reader,capnp::_::IndexingIterator<capnp::List<capnp::compiler::Token,(capnp::Kind)3>::Reader_const,capnp::compiler::Token::Reader>>,capnp::compiler::C___3>::Reader_const,capnp::compiler::Token::Reader>>_capnp__compiler__CapnpParser__DeclParserResult>_>>
          (Arena *this,
          OneOf_<kj::parse::ParserRef<kj::parse::IteratorInput<capnp::compiler::Token::Reader,_capnp::_::IndexingIterator<const_capnp::List<capnp::compiler::Token,_(capnp::Kind)3>::Reader,_capnp::compiler::Token::Reader>_>,_capnp::compiler::CapnpParser::DeclParserResult>_&,_kj::parse::ParserRef<kj::parse::IteratorInput<capnp::compiler::Token::Reader,_capnp::_::IndexingIterator<const_capnp::List<capnp::compiler::Token,_(capnp::Kind)3>::Reader,_capnp::compiler::Token::Reader>_>,_capnp::compiler::CapnpParser::DeclParserResult>_&,_kj::parse::ParserRef<kj::parse::IteratorInput<capnp::compiler::Token::Reader,_capnp::_::IndexingIterator<const_capnp::List<capnp::compiler::Token,_(capnp::Kind)3>::Reader,_capnp::compiler::Token::Reader>_>,_capnp::compiler::CapnpParser::DeclParserResult>_&,_kj::parse::ParserRef<kj::parse::IteratorInput<capnp::compiler::Token::Reader,_capnp::_::IndexingIterator<const_capnp::List<capnp::compiler::Token,_(capnp::Kind)3>::Reader,_capnp::compiler::Token::Reader>_>,_capnp::compiler::CapnpParser::DeclParserResult>_&,_kj::parse::ParserRef<kj::parse::IteratorInput<capnp::compiler::Token::Reader,_capnp::_::IndexingIterator<const_capnp::List<capnp::compiler::Token,_(capnp::Kind)3>::Reader,_capnp::compiler::Token::Reader>_>,_capnp::compiler::CapnpParser::DeclParserResult>_&,_kj::parse::ParserRef<kj::parse::IteratorInput<capnp::compiler::Token::Reader,_capnp::_::IndexingIterator<const_capnp::List<capnp::compiler::Token,_(capnp::Kind)3>::Reader,_capnp::compiler::Token::Reader>_>,_capnp::compiler::CapnpParser::DeclParserResult>_&>
          *params)

{
  OneOf_<kj::parse::ParserRef<kj::parse::IteratorInput<capnp::compiler::Token::Reader,_capnp::_::IndexingIterator<const_capnp::List<capnp::compiler::Token,_(capnp::Kind)3>::Reader,_capnp::compiler::Token::Reader>_>,_capnp::compiler::CapnpParser::DeclParserResult>_&,_kj::parse::ParserRef<kj::parse::IteratorInput<capnp::compiler::Token::Reader,_capnp::_::IndexingIterator<const_capnp::List<capnp::compiler::Token,_(capnp::Kind)3>::Reader,_capnp::compiler::Token::Reader>_>,_capnp::compiler::CapnpParser::DeclParserResult>_&,_kj::parse::ParserRef<kj::parse::IteratorInput<capnp::compiler::Token::Reader,_capnp::_::IndexingIterator<const_capnp::List<capnp::compiler::Token,_(capnp::Kind)3>::Reader,_capnp::compiler::Token::Reader>_>,_capnp::compiler::CapnpParser::DeclParserResult>_&,_kj::parse::ParserRef<kj::parse::IteratorInput<capnp::compiler::Token::Reader,_capnp::_::IndexingIterator<const_capnp::List<capnp::compiler::Token,_(capnp::Kind)3>::Reader,_capnp::compiler::Token::Reader>_>,_capnp::compiler::CapnpParser::DeclParserResult>_&,_kj::parse::ParserRef<kj::parse::IteratorInput<capnp::compiler::Token::Reader,_capnp::_::IndexingIterator<const_capnp::List<capnp::compiler::Token,_(capnp::Kind)3>::Reader,_capnp::compiler::Token::Reader>_>,_capnp::compiler::CapnpParser::DeclParserResult>_&,_kj::parse::ParserRef<kj::parse::IteratorInput<capnp::compiler::Token::Reader,_capnp::_::IndexingIterator<const_capnp::List<capnp::compiler::Token,_(capnp::Kind)3>::Reader,_capnp::compiler::Token::Reader>_>,_capnp::compiler::CapnpParser::DeclParserResult>_&>
  *location;
  OneOf_<kj::parse::ParserRef<kj::parse::IteratorInput<capnp::compiler::Token::Reader,_capnp::_::IndexingIterator<const_capnp::List<capnp::compiler::Token,_(capnp::Kind)3>::Reader,_capnp::compiler::Token::Reader>_>,_capnp::compiler::CapnpParser::DeclParserResult>_&,_kj::parse::ParserRef<kj::parse::IteratorInput<capnp::compiler::Token::Reader,_capnp::_::IndexingIterator<const_capnp::List<capnp::compiler::Token,_(capnp::Kind)3>::Reader,_capnp::compiler::Token::Reader>_>,_capnp::compiler::CapnpParser::DeclParserResult>_&,_kj::parse::ParserRef<kj::parse::IteratorInput<capnp::compiler::Token::Reader,_capnp::_::IndexingIterator<const_capnp::List<capnp::compiler::Token,_(capnp::Kind)3>::Reader,_capnp::compiler::Token::Reader>_>,_capnp::compiler::CapnpParser::DeclParserResult>_&,_kj::parse::ParserRef<kj::parse::IteratorInput<capnp::compiler::Token::Reader,_capnp::_::IndexingIterator<const_capnp::List<capnp::compiler::Token,_(capnp::Kind)3>::Reader,_capnp::compiler::Token::Reader>_>,_capnp::compiler::CapnpParser::DeclParserResult>_&,_kj::parse::ParserRef<kj::parse::IteratorInput<capnp::compiler::Token::Reader,_capnp::_::IndexingIterator<const_capnp::List<capnp::compiler::Token,_(capnp::Kind)3>::Reader,_capnp::compiler::Token::Reader>_>,_capnp::compiler::CapnpParser::DeclParserResult>_&,_kj::parse::ParserRef<kj::parse::IteratorInput<capnp::compiler::Token::Reader,_capnp::_::IndexingIterator<const_capnp::List<capnp::compiler::Token,_(capnp::Kind)3>::Reader,_capnp::compiler::Token::Reader>_>,_capnp::compiler::CapnpParser::DeclParserResult>_&>
  *params_00;
  OneOf_<kj::parse::ParserRef<kj::parse::IteratorInput<capnp::compiler::Token::Reader,_capnp::_::IndexingIterator<const_capnp::List<capnp::compiler::Token,_(capnp::Kind)3>::Reader,_capnp::compiler::Token::Reader>_>,_capnp::compiler::CapnpParser::DeclParserResult>_&,_kj::parse::ParserRef<kj::parse::IteratorInput<capnp::compiler::Token::Reader,_capnp::_::IndexingIterator<const_capnp::List<capnp::compiler::Token,_(capnp::Kind)3>::Reader,_capnp::compiler::Token::Reader>_>,_capnp::compiler::CapnpParser::DeclParserResult>_&,_kj::parse::ParserRef<kj::parse::IteratorInput<capnp::compiler::Token::Reader,_capnp::_::IndexingIterator<const_capnp::List<capnp::compiler::Token,_(capnp::Kind)3>::Reader,_capnp::compiler::Token::Reader>_>,_capnp::compiler::CapnpParser::DeclParserResult>_&,_kj::parse::ParserRef<kj::parse::IteratorInput<capnp::compiler::Token::Reader,_capnp::_::IndexingIterator<const_capnp::List<capnp::compiler::Token,_(capnp::Kind)3>::Reader,_capnp::compiler::Token::Reader>_>,_capnp::compiler::CapnpParser::DeclParserResult>_&,_kj::parse::ParserRef<kj::parse::IteratorInput<capnp::compiler::Token::Reader,_capnp::_::IndexingIterator<const_capnp::List<capnp::compiler::Token,_(capnp::Kind)3>::Reader,_capnp::compiler::Token::Reader>_>,_capnp::compiler::CapnpParser::DeclParserResult>_&,_kj::parse::ParserRef<kj::parse::IteratorInput<capnp::compiler::Token::Reader,_capnp::_::IndexingIterator<const_capnp::List<capnp::compiler::Token,_(capnp::Kind)3>::Reader,_capnp::compiler::Token::Reader>_>,_capnp::compiler::CapnpParser::DeclParserResult>_&>
  *result;
  OneOf_<kj::parse::ParserRef<kj::parse::IteratorInput<capnp::compiler::Token::Reader,_capnp::_::IndexingIterator<const_capnp::List<capnp::compiler::Token,_(capnp::Kind)3>::Reader,_capnp::compiler::Token::Reader>_>,_capnp::compiler::CapnpParser::DeclParserResult>_&,_kj::parse::ParserRef<kj::parse::IteratorInput<capnp::compiler::Token::Reader,_capnp::_::IndexingIterator<const_capnp::List<capnp::compiler::Token,_(capnp::Kind)3>::Reader,_capnp::compiler::Token::Reader>_>,_capnp::compiler::CapnpParser::DeclParserResult>_&,_kj::parse::ParserRef<kj::parse::IteratorInput<capnp::compiler::Token::Reader,_capnp::_::IndexingIterator<const_capnp::List<capnp::compiler::Token,_(capnp::Kind)3>::Reader,_capnp::compiler::Token::Reader>_>,_capnp::compiler::CapnpParser::DeclParserResult>_&,_kj::parse::ParserRef<kj::parse::IteratorInput<capnp::compiler::Token::Reader,_capnp::_::IndexingIterator<const_capnp::List<capnp::compiler::Token,_(capnp::Kind)3>::Reader,_capnp::compiler::Token::Reader>_>,_capnp::compiler::CapnpParser::DeclParserResult>_&,_kj::parse::ParserRef<kj::parse::IteratorInput<capnp::compiler::Token::Reader,_capnp::_::IndexingIterator<const_capnp::List<capnp::compiler::Token,_(capnp::Kind)3>::Reader,_capnp::compiler::Token::Reader>_>,_capnp::compiler::CapnpParser::DeclParserResult>_&,_kj::parse::ParserRef<kj::parse::IteratorInput<capnp::compiler::Token::Reader,_capnp::_::IndexingIterator<const_capnp::List<capnp::compiler::Token,_(capnp::Kind)3>::Reader,_capnp::compiler::Token::Reader>_>,_capnp::compiler::CapnpParser::DeclParserResult>_&>
  *params_local;
  Arena *this_local;
  
  location = (OneOf_<kj::parse::ParserRef<kj::parse::IteratorInput<capnp::compiler::Token::Reader,_capnp::_::IndexingIterator<const_capnp::List<capnp::compiler::Token,_(capnp::Kind)3>::Reader,_capnp::compiler::Token::Reader>_>,_capnp::compiler::CapnpParser::DeclParserResult>_&,_kj::parse::ParserRef<kj::parse::IteratorInput<capnp::compiler::Token::Reader,_capnp::_::IndexingIterator<const_capnp::List<capnp::compiler::Token,_(capnp::Kind)3>::Reader,_capnp::compiler::Token::Reader>_>,_capnp::compiler::CapnpParser::DeclParserResult>_&,_kj::parse::ParserRef<kj::parse::IteratorInput<capnp::compiler::Token::Reader,_capnp::_::IndexingIterator<const_capnp::List<capnp::compiler::Token,_(capnp::Kind)3>::Reader,_capnp::compiler::Token::Reader>_>,_capnp::compiler::CapnpParser::DeclParserResult>_&,_kj::parse::ParserRef<kj::parse::IteratorInput<capnp::compiler::Token::Reader,_capnp::_::IndexingIterator<const_capnp::List<capnp::compiler::Token,_(capnp::Kind)3>::Reader,_capnp::compiler::Token::Reader>_>,_capnp::compiler::CapnpParser::DeclParserResult>_&,_kj::parse::ParserRef<kj::parse::IteratorInput<capnp::compiler::Token::Reader,_capnp::_::IndexingIterator<const_capnp::List<capnp::compiler::Token,_(capnp::Kind)3>::Reader,_capnp::compiler::Token::Reader>_>,_capnp::compiler::CapnpParser::DeclParserResult>_&,_kj::parse::ParserRef<kj::parse::IteratorInput<capnp::compiler::Token::Reader,_capnp::_::IndexingIterator<const_capnp::List<capnp::compiler::Token,_(capnp::Kind)3>::Reader,_capnp::compiler::Token::Reader>_>,_capnp::compiler::CapnpParser::DeclParserResult>_&>
              *)allocateBytes(this,0x38,8,false);
  params_00 = fwd<kj::parse::OneOf_<kj::parse::ParserRef<kj::parse::IteratorInput<capnp::compiler::Token::Reader,capnp::_::IndexingIterator<capnp::List<capnp::compiler::Token,(capnp::Kind)3>::Reader_const,capnp::compiler::Token::Reader>>,capnp::compiler::CapnpParser::DeclParserResult>&,kj::parse::ParserRef<kj::parse::IteratorInput<capnp::compiler::Token::Reader,capnp::_::IndexingIterator<capnp::List<capnp::compiler::Token,(capnp::Kind)3>::Reader_const,capnp::compiler::Token::Reader>>,capnp::compiler::CapnpParser::DeclParserResult>&,kj::parse::ParserRef<kj::parse::IteratorInput<capnp::compiler::Token::Reader,capnp::_::IndexingIterator<capnp::List<capnp::compiler::Token,(capnp::Kind)3>::Reader_const,capnp::compiler::Token::Reader>>,capnp::compiler::CapnpParser::DeclParserResult>&,kj::parse::ParserRef<kj::parse::IteratorInput<capnp::compiler::Token::Reader,capnp::_::IndexingIterator<capnp::List<capnp::compiler::Token,(capnp::Kind)3>::Reader_const,capnp::compiler::Token::Reader>>,capnp::compiler::CapnpParser::DeclParserResult>&,kj::parse::ParserRef<kj::parse::IteratorInput<capnp::compiler::Token::Reader,capnp::_::IndexingIterator<capnp::List<capnp::compiler::Token,(capnp::Kind)3>::Reader_const,capnp::compiler::Token::Reader>>,capnp::compiler::CapnpParser::DeclParserResult>&,kj::parse::ParserRef<kj::parse::IteratorInput<capnp::compiler::Token::Reader,capnp::_::IndexingIterator<capnp::List<capnp::compiler::Token,(capnp::Kind)3>::Reader_const,capnp::compiler::Token::Reader>>,capnp::compiler::CapnpParser::DeclParserResult>&>>
                        (params);
  ctor<kj::parse::OneOf_<kj::parse::ParserRef<kj::parse::IteratorInput<capnp::compiler::Token::Reader,capnp::_::IndexingIterator<capnp::List<capnp::compiler::Token,(capnp::Kind)3>::Reader_const,capnp::compiler::Token::Reader>>,capnp::compiler::CapnpParser::DeclParserResult>&,kj::parse::ParserRef<kj::parse::IteratorInput<capnp::compiler::Token::Reader,capnp::_::IndexingIterator<capnp::List<capnp::compiler::Token,(capnp::Kind)3>::Reader_const,capnp::compiler::Token::Reader>>,capnp::compiler::CapnpParser::DeclParserResult>&,kj::parse::ParserRef<kj::parse::IteratorInput<capnp::compiler::Token::Reader,capnp::_::IndexingIterator<capnp::List<capnp::compiler::Token,(capnp::Kind)3>::Reader_const,capnp::compiler::Token::Reader>>,capnp::compiler::CapnpParser::DeclParserResult>&,kj::parse::ParserRef<kj::parse::IteratorInput<capnp::compiler::Token::Reader,capnp::_::IndexingIterator<capnp::List<capnp::compiler::Token,(capnp::Kind)3>::Reader_const,capnp::compiler::Token::Reader>>,capnp::compiler::Capnp___3>::Reader_const,capnp::compiler::Token::Reader>>_capnp__compiler__CapnpParser__DeclParserResult>_>>
            (location,params_00);
  return location;
}

Assistant:

T& Arena::allocate(Params&&... params) {
  T& result = *reinterpret_cast<T*>(allocateBytes(
      sizeof(T), alignof(T), !KJ_HAS_TRIVIAL_DESTRUCTOR(T)));
  if (!KJ_HAS_TRIVIAL_CONSTRUCTOR(T) || sizeof...(Params) > 0) {
    ctor(result, kj::fwd<Params>(params)...);
  }
  if (!KJ_HAS_TRIVIAL_DESTRUCTOR(T)) {
    setDestructor(&result, &destroyObject<T>);
  }
  return result;
}